

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O0

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::angularVelocityReset
          (DeadReckoningCalculator *this,Vector *AngularVelocity)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  KFLOAT32 *pKVar6;
  double dVar7;
  EulerAngles local_30;
  Vector *local_18;
  Vector *AngularVelocity_local;
  DeadReckoningCalculator *this_local;
  
  local_18 = AngularVelocity;
  AngularVelocity_local = (Vector *)this;
  DATA_TYPE::Vector::operator=(&this->m_initAngularVelocity,AngularVelocity);
  toEulerAngularVelocity(&local_30,this,local_18,&this->m_initOrientation);
  DATA_TYPE::EulerAngles::operator=(&this->m_initEulerAngularVelocity,&local_30);
  DATA_TYPE::EulerAngles::~EulerAngles(&local_30);
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,0);
  fVar1 = (float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,0);
  (this->m_wwMatrix).Data[0][0] = fVar1 * (float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,0);
  fVar1 = (float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,1);
  (this->m_wwMatrix).Data[0][1] = fVar1 * (float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,0);
  fVar1 = (float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,2);
  (this->m_wwMatrix).Data[0][2] = fVar1 * (float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,1);
  fVar1 = (float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,0);
  (this->m_wwMatrix).Data[1][0] = fVar1 * (float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,1);
  fVar1 = (float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,1);
  (this->m_wwMatrix).Data[1][1] = fVar1 * (float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,1);
  fVar1 = (float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,2);
  (this->m_wwMatrix).Data[1][2] = fVar1 * (float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,2);
  fVar1 = (float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,0);
  (this->m_wwMatrix).Data[2][0] = fVar1 * (float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,2);
  fVar1 = (float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,1);
  (this->m_wwMatrix).Data[2][1] = fVar1 * (float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,2);
  fVar1 = (float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,2);
  (this->m_wwMatrix).Data[2][2] = fVar1 * (float)*pKVar6;
  (this->m_SkewOmegaMatrix).Data[0][0] = 0.0;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,2);
  (this->m_SkewOmegaMatrix).Data[0][1] = -(float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,1);
  (this->m_SkewOmegaMatrix).Data[0][2] = (float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,2);
  (this->m_SkewOmegaMatrix).Data[1][0] = (float)*pKVar6;
  (this->m_SkewOmegaMatrix).Data[1][1] = 0.0;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,0);
  (this->m_SkewOmegaMatrix).Data[1][2] = -(float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,1);
  (this->m_SkewOmegaMatrix).Data[2][0] = -(float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,0);
  (this->m_SkewOmegaMatrix).Data[2][1] = (float)*pKVar6;
  (this->m_SkewOmegaMatrix).Data[2][2] = 0.0;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,0);
  fVar1 = (float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,0);
  fVar2 = (float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,1);
  fVar3 = (float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,1);
  fVar4 = (float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,2);
  fVar5 = (float)*pKVar6;
  pKVar6 = DATA_TYPE::Vector::operator[](&this->m_initAngularVelocity,2);
  dVar7 = std::sqrt((double)(ulong)(uint)(fVar5 * (float)*pKVar6 + fVar1 * fVar2 + fVar3 * fVar4));
  this->m_f64Magnitude = SUB84(dVar7,0);
  return;
}

Assistant:

void DeadReckoningCalculator::angularVelocityReset( const Vector & AngularVelocity )
{
    m_initAngularVelocity = AngularVelocity;

    m_initEulerAngularVelocity = toEulerAngularVelocity(AngularVelocity, m_initOrientation);

    // Create the ww matrix
    m_wwMatrix.Data[0][0] = m_initAngularVelocity[0] * m_initAngularVelocity[0];
    m_wwMatrix.Data[0][1] = m_initAngularVelocity[0] * m_initAngularVelocity[1];
    m_wwMatrix.Data[0][2] = m_initAngularVelocity[0] * m_initAngularVelocity[2];

    m_wwMatrix.Data[1][0] = m_initAngularVelocity[1] * m_initAngularVelocity[0];
    m_wwMatrix.Data[1][1] = m_initAngularVelocity[1] * m_initAngularVelocity[1];
    m_wwMatrix.Data[1][2] = m_initAngularVelocity[1] * m_initAngularVelocity[2];

    m_wwMatrix.Data[2][0] = m_initAngularVelocity[2] * m_initAngularVelocity[0];
    m_wwMatrix.Data[2][1] = m_initAngularVelocity[2] * m_initAngularVelocity[1];
    m_wwMatrix.Data[2][2] = m_initAngularVelocity[2] * m_initAngularVelocity[2];

    m_SkewOmegaMatrix.Data[0][0] = 0;
    m_SkewOmegaMatrix.Data[0][1] = - m_initAngularVelocity[2];
    m_SkewOmegaMatrix.Data[0][2] = m_initAngularVelocity[1];

    m_SkewOmegaMatrix.Data[1][0] = m_initAngularVelocity[2];
    m_SkewOmegaMatrix.Data[1][1] = 0;
    m_SkewOmegaMatrix.Data[1][2] = - m_initAngularVelocity[0];

    m_SkewOmegaMatrix.Data[2][0] = - m_initAngularVelocity[1];
    m_SkewOmegaMatrix.Data[2][1] = m_initAngularVelocity[0];
    m_SkewOmegaMatrix.Data[2][2] = 0;

    m_f64Magnitude = sqrt( m_initAngularVelocity[0] * m_initAngularVelocity[0] +
                           m_initAngularVelocity[1] * m_initAngularVelocity[1] +
                           m_initAngularVelocity[2] * m_initAngularVelocity[2] );
}